

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O2

size_t brotli::ComputeDistanceCode(size_t distance,size_t max_distance,int quality,int *dist_cache)

{
  size_t k;
  size_t sVar1;
  size_t sStack_8;
  
  if (max_distance < distance) {
LAB_0016a786:
    return distance + 0xf;
  }
  if ((long)*dist_cache == distance) {
    return 0;
  }
  if ((long)dist_cache[1] == distance) {
    sStack_8 = 1;
  }
  else if ((long)dist_cache[2] == distance) {
    sStack_8 = 2;
  }
  else {
    if ((long)dist_cache[3] != distance) {
      if (5 < distance && 3 < quality) {
        for (sVar1 = 4; sVar1 != 0x10; sVar1 = sVar1 + 1) {
          if (((long)(int)(&kDistanceCacheOffset)[sVar1] +
               (long)dist_cache[(uint)(&kDistanceCacheIndex)[sVar1]] == distance) &&
             (ComputeDistanceCode::kLimits[sVar1] <= distance)) {
            return sVar1;
          }
        }
      }
      goto LAB_0016a786;
    }
    sStack_8 = 3;
  }
  return sStack_8;
}

Assistant:

inline size_t ComputeDistanceCode(size_t distance,
                                  size_t max_distance,
                                  int quality,
                                  const int* dist_cache) {
  if (distance <= max_distance) {
    if (distance == static_cast<size_t>(dist_cache[0])) {
      return 0;
    } else if (distance == static_cast<size_t>(dist_cache[1])) {
      return 1;
    } else if (distance == static_cast<size_t>(dist_cache[2])) {
      return 2;
    } else if (distance == static_cast<size_t>(dist_cache[3])) {
      return 3;
    } else if (quality > 3 && distance >= 6) {
      for (size_t k = 4; k < kNumDistanceShortCodes; ++k) {
        size_t idx = kDistanceCacheIndex[k];
        size_t candidate =
            static_cast<size_t>(dist_cache[idx] + kDistanceCacheOffset[k]);
        static const size_t kLimits[16] = {  0,  0,  0,  0,
                                             6,  6, 11, 11,
                                            11, 11, 11, 11,
                                            12, 12, 12, 12 };
        if (distance == candidate && distance >= kLimits[k]) {
          return k;
        }
      }
    }
  }
  return distance + 15;
}